

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  int iVar4;
  char *pcVar5;
  GeneratorOptions *options_00;
  uint *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  FieldDescriptor *field_00;
  AlphaNum *a;
  AlphaNum *a_00;
  undefined1 in_R9B;
  undefined1 in_stack_fffffffffffffda8;
  Printer *this_00;
  string local_1f0;
  AlphaNum local_1d0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  AlphaNum local_100;
  string local_d0;
  GeneratorOptions *local_b0;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  string local_98;
  string local_68;
  undefined1 local_48 [8];
  string typed_annotation;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  typed_annotation.field_2._8_8_ = field;
  bVar1 = anon_unknown_0::HasFieldPresence(options,field);
  if ((bVar1) &&
     (CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)typed_annotation.field_2._8_8_),
     CVar2 != CPPTYPE_MESSAGE)) {
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              ((string *)local_48,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)typed_annotation.field_2._8_8_,(FieldDescriptor *)0x0,false,false
               ,false,BYTES_DEFAULT,(bool)in_stack_fffffffffffffda8);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)typed_annotation.field_2._8_8_,field_00);
    args_1 = (uint *)&local_68;
    io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n",
               (char (*) [6])0x784c5e,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               (char (*) [5])0x7cd92b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_98,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)typed_annotation.field_2._8_8_,(FieldDescriptor *)0x2,
               BYTES_DEFAULT,(bool)in_R9B);
    bVar1 = FieldDescriptor::is_map((FieldDescriptor *)typed_annotation.field_2._8_8_);
    pcVar5 = "";
    if (bVar1) {
      pcVar5 = "true";
    }
    args_1 = (uint *)&local_98;
    key_field = (FieldDescriptor *)pcVar5;
    io::Printer::Print<char[5],std::__cxx11::string,char[7],char_const*>
              (printer,"  f = message.get$name$($nolazy$);\n",(char (*) [5])0x77db8d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               (char (*) [7])"nolazy",(char **)&key_field);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)typed_annotation.field_2._8_8_);
  if (bVar1) {
    io::Printer::Print<>(printer,"  if (f && f.getLength() > 0) {\n");
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)typed_annotation.field_2._8_8_);
    if (bVar1) {
      io::Printer::Print<>(printer,"  if (f.length > 0) {\n");
    }
    else {
      bVar1 = anon_unknown_0::HasFieldPresence
                        (options,(FieldDescriptor *)typed_annotation.field_2._8_8_);
      if (bVar1) {
        io::Printer::Print<>(printer,"  if (f != null) {\n");
      }
      else {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)typed_annotation.field_2._8_8_);
        args_1 = &switchD_00493712::switchdataD_007722e8;
        switch(CVar2) {
        case CPPTYPE_INT32:
        case CPPTYPE_INT64:
        case CPPTYPE_UINT32:
        case CPPTYPE_UINT64:
          bVar1 = anon_unknown_0::IsIntegralFieldWithStringJSType
                            ((FieldDescriptor *)typed_annotation.field_2._8_8_);
          if (bVar1) {
            io::Printer::Print<>(printer,"  if (parseInt(f, 10) !== 0) {\n");
          }
          else {
            io::Printer::Print<>(printer,"  if (f !== 0) {\n");
          }
          break;
        case CPPTYPE_DOUBLE:
        case CPPTYPE_FLOAT:
        case CPPTYPE_ENUM:
          io::Printer::Print<>(printer,"  if (f !== 0.0) {\n");
          break;
        case CPPTYPE_BOOL:
          io::Printer::Print<>(printer,"  if (f) {\n");
          break;
        case CPPTYPE_STRING:
          io::Printer::Print<>(printer,"  if (f.length > 0) {\n");
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                        ,0xcd5,
                        "void google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField(const GeneratorOptions &, io::Printer *, const FieldDescriptor *) const"
                       );
        }
      }
    }
  }
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)typed_annotation.field_2._8_8_);
  if (bVar1) {
    value_field = anon_unknown_0::MapFieldKey((FieldDescriptor *)typed_annotation.field_2._8_8_);
    local_b0 = (GeneratorOptions *)
               anon_unknown_0::MapFieldValue((FieldDescriptor *)typed_annotation.field_2._8_8_);
    iVar4 = FieldDescriptor::number((FieldDescriptor *)typed_annotation.field_2._8_8_);
    strings::AlphaNum::AlphaNum(&local_100,iVar4);
    StrCat_abi_cxx11_(&local_d0,(protobuf *)&local_100,a);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_120,(_anonymous_namespace_ *)options,(GeneratorOptions *)value_field,
               (FieldDescriptor *)args_1);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_140,(_anonymous_namespace_ *)options,local_b0,(FieldDescriptor *)args_1);
    pbVar6 = &local_d0;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              (printer,"    f.serializeBinary($index$, writer, $keyWriterFn$, $valueWriterFn$",
               (char (*) [6])0x784c5e,pbVar6,(char (*) [12])"keyWriterFn",&local_120,
               (char (*) [14])"valueWriterFn",&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_d0);
    TVar3 = FieldDescriptor::type((FieldDescriptor *)local_b0);
    if (TVar3 == TYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)local_b0);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_160,(_anonymous_namespace_ *)options,options_00,(Descriptor *)pbVar6);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", $messageType$.serializeBinaryToWriter",(char (*) [12])"messageType",
                 &local_160);
      std::__cxx11::string::~string((string *)&local_160);
    }
    io::Printer::Print<>(printer,");\n");
  }
  else {
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              (&local_180,(_anonymous_namespace_ *)typed_annotation.field_2._8_8_,
               (FieldDescriptor *)0x1,SUB81(args_1,0));
    iVar4 = FieldDescriptor::number((FieldDescriptor *)typed_annotation.field_2._8_8_);
    strings::AlphaNum::AlphaNum(&local_1d0,iVar4);
    StrCat_abi_cxx11_(&local_1a0,(protobuf *)&local_1d0,a_00);
    pbVar6 = &local_180;
    io::Printer::Print<char[7],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,"    writer.write$method$(\n      $index$,\n      f",(char (*) [7])"method",
               pbVar6,(char (*) [6])0x784c5e,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)typed_annotation.field_2._8_8_);
    if ((CVar2 != CPPTYPE_MESSAGE) ||
       (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)typed_annotation.field_2._8_8_), bVar1))
    {
      io::Printer::Print<>(printer,"\n");
    }
    else {
      this_00 = printer;
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_1f0,(_anonymous_namespace_ *)options,
                 (GeneratorOptions *)typed_annotation.field_2._8_8_,(FieldDescriptor *)pbVar6);
      io::Printer::Print<char[7],std::__cxx11::string>
                (this_00,",\n      $submsg$.serializeBinaryToWriter\n",(char (*) [7])"submsg",
                 &local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    io::Printer::Print<>(printer,"    );\n");
  }
  io::Printer::Print<>(printer,"  }\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  if (HasFieldPresence(options, field) &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ BYTES_DEFAULT);
    printer->Print(
        "  f = /** @type {$type$} */ "
        "(jspb.Message.getField(message, $index$));\n",
        "index", JSFieldIndex(field), "type", typed_annotation);
  } else {
    printer->Print(
        "  f = message.get$name$($nolazy$);\n", "name",
        JSGetterName(options, field, BYTES_U8),
        // No lazy creation for maps containers -- fastpath the empty case.
        "nolazy", field->is_map() ? "true" : "");
  }

  // Print an `if (condition)` statement that evaluates to true if the field
  // goes on the wire.
  if (field->is_map()) {
    printer->Print("  if (f && f.getLength() > 0) {\n");
  } else if (field->is_repeated()) {
    printer->Print("  if (f.length > 0) {\n");
  } else {
    if (HasFieldPresence(options, field)) {
      printer->Print("  if (f != null) {\n");
    } else {
      // No field presence: serialize onto the wire only if value is
      // non-default.  Defaults are documented here:
      // https://goto.google.com/lhdfm
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64: {
          if (IsIntegralFieldWithStringJSType(field)) {
            // We can use `parseInt` here even though it will not be precise for
            // 64-bit quantities because we are only testing for zero/nonzero,
            // and JS numbers (64-bit floating point values, i.e., doubles) are
            // integer-precise in the range that includes zero.
            printer->Print("  if (parseInt(f, 10) !== 0) {\n");
          } else {
            printer->Print("  if (f !== 0) {\n");
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_ENUM:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_DOUBLE:
          printer->Print("  if (f !== 0.0) {\n");
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          printer->Print("  if (f) {\n");
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          printer->Print("  if (f.length > 0) {\n");
          break;
        default:
          assert(false);
          break;
      }
    }
  }

  // Write the field on the wire.
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "    f.serializeBinary($index$, writer, "
        "$keyWriterFn$, $valueWriterFn$",
        "index", StrCat(field->number()), "keyWriterFn",
        JSBinaryWriterMethodName(options, key_field), "valueWriterFn",
        JSBinaryWriterMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.serializeBinaryToWriter", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
  } else {
    printer->Print(
        "    writer.write$method$(\n"
        "      $index$,\n"
        "      f",
        "method", JSBinaryReadWriteMethodName(field, /* is_writer = */ true),
        "index", StrCat(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_map()) {
      printer->Print(
          ",\n"
          "      $submsg$.serializeBinaryToWriter\n",
          "submsg", SubmessageTypeRef(options, field));
    } else {
      printer->Print("\n");
    }

    printer->Print("    );\n");
  }

  // Close the `if`.
  printer->Print("  }\n");
}